

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkTests.c
# Opt level: O3

void runChunkTests(void)

{
  _Bool _Var1;
  int iVar2;
  queue *pqVar3;
  chunk *pcVar4;
  uint64_t *puVar5;
  size_t sVar6;
  chunk *pcVar7;
  chunk *pcVar8;
  chunk *pcVar9;
  chunk *pcVar10;
  chunk *pcVar11;
  
  printf("testCreateChunkQueue()");
  pqVar3 = createQueue(5);
  if (pqVar3->capacity != 5) {
    __assert_fail("q->capacity == TEST_QUE_SIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/chunkTests.c"
                  ,7,"void testCreateChunkQueue()");
  }
  if (pqVar3->size != 0) {
    __assert_fail("q->size == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/chunkTests.c"
                  ,8,"void testCreateChunkQueue()");
  }
  if (pqVar3->head != 1) {
    __assert_fail("q->head == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/chunkTests.c"
                  ,9,"void testCreateChunkQueue()");
  }
  if (pqVar3->tail != 0) {
    __assert_fail("q->tail == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/chunkTests.c"
                  ,10,"void testCreateChunkQueue()");
  }
  puts(" passed");
  destroyQueue(pqVar3);
  printf("testChunkEnque()");
  pcVar4 = createChunk();
  pcVar4->action = '\a';
  puVar5 = (uint64_t *)malloc(7);
  pcVar4->data = puVar5;
  *(undefined4 *)puVar5 = 0x61746144;
  *(undefined4 *)((long)puVar5 + 3) = 0x312061;
  sVar6 = strlen((char *)puVar5);
  pcVar4->data_size = sVar6;
  pqVar3 = createQueue(5);
  enque(pcVar4,pqVar3);
  iVar2 = strcmp((char *)pqVar3->elements[1]->data,"Data 1");
  if (iVar2 != 0) {
    __assert_fail("strcmp((const char*)q->elements[1]->data, DATA1) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/chunkTests.c"
                  ,0x1d,"void testChunkEnque()");
  }
  puts(" passed");
  destroyQueue(pqVar3);
  printf("testChunkDeque()");
  pcVar4 = createChunk();
  pcVar4->action = '\a';
  puVar5 = (uint64_t *)malloc(7);
  pcVar4->data = puVar5;
  *(undefined4 *)puVar5 = 0x61746144;
  *(undefined4 *)((long)puVar5 + 3) = 0x312061;
  sVar6 = strlen((char *)puVar5);
  pcVar4->data_size = sVar6;
  pqVar3 = createQueue(5);
  _Var1 = enque(pcVar4,pqVar3);
  if (!_Var1) {
    __assert_fail("enque(chunk1, q) == true",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/chunkTests.c"
                  ,0x2e,"void testChunkDeque()");
  }
  _Var1 = deque(pqVar3);
  if (!_Var1) {
    __assert_fail("deque(q) == true",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/chunkTests.c"
                  ,0x2f,"void testChunkDeque()");
  }
  if (pqVar3->size != 0) {
    __assert_fail("q->size == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/chunkTests.c"
                  ,0x30,"void testChunkDeque()");
  }
  if (*pqVar3->elements != (chunk *)0x0) {
    __assert_fail("q->elements[0] == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/chunkTests.c"
                  ,0x31,"void testChunkDeque()");
  }
  puts(" passed");
  destroyChunk(pcVar4);
  destroyQueue(pqVar3);
  printf("testFront()");
  pcVar4 = createChunk();
  pcVar4->action = '\a';
  puVar5 = (uint64_t *)malloc(7);
  pcVar4->data = puVar5;
  *(undefined4 *)puVar5 = 0x61746144;
  *(undefined4 *)((long)puVar5 + 3) = 0x312061;
  sVar6 = strlen((char *)puVar5);
  pcVar4->data_size = sVar6;
  pqVar3 = createQueue(5);
  enque(pcVar4,pqVar3);
  pcVar4 = front(pqVar3);
  if (pcVar4->action != '\a') {
    __assert_fail("test1->action == WRITE",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/chunkTests.c"
                  ,0x45,"void testChunkFront()");
  }
  iVar2 = strcmp((char *)pcVar4->data,"Data 1");
  if (iVar2 != 0) {
    __assert_fail("strcmp((const char*)test1->data, DATA1) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/chunkTests.c"
                  ,0x46,"void testChunkFront()");
  }
  if (pcVar4->data_size != 6) {
    __assert_fail("test1->data_size == strlen((const char*)DATA1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/chunkTests.c"
                  ,0x47,"void testChunkFront()");
  }
  puts(" passed");
  destroyQueue(pqVar3);
  printf("testChunkLimit()");
  pcVar4 = createChunk();
  pcVar4->action = '\a';
  puVar5 = (uint64_t *)malloc(7);
  pcVar4->data = puVar5;
  *(undefined4 *)puVar5 = 0x61746144;
  *(undefined4 *)((long)puVar5 + 3) = 0x312061;
  pcVar4->data_size = 6;
  pcVar7 = createChunk();
  pcVar7->action = '\a';
  puVar5 = (uint64_t *)malloc(7);
  pcVar7->data = puVar5;
  *(undefined4 *)puVar5 = 0x61746144;
  *(undefined4 *)((long)puVar5 + 3) = 0x322061;
  pcVar7->data_size = 6;
  pcVar8 = createChunk();
  pcVar8->action = '\a';
  puVar5 = (uint64_t *)malloc(7);
  pcVar8->data = puVar5;
  *(undefined4 *)puVar5 = 0x61746144;
  *(undefined4 *)((long)puVar5 + 3) = 0x332061;
  pcVar8->data_size = 6;
  pcVar9 = createChunk();
  pcVar9->action = '\a';
  puVar5 = (uint64_t *)malloc(7);
  pcVar9->data = puVar5;
  *(undefined4 *)puVar5 = 0x61746144;
  *(undefined4 *)((long)puVar5 + 3) = 0x342061;
  pcVar9->data_size = 6;
  pcVar10 = createChunk();
  pcVar10->action = '\a';
  puVar5 = (uint64_t *)malloc(7);
  pcVar10->data = puVar5;
  *(undefined4 *)puVar5 = 0x61746144;
  *(undefined4 *)((long)puVar5 + 3) = 0x352061;
  pcVar10->data_size = 6;
  pcVar11 = createChunk();
  pcVar11->action = '\x01';
  pcVar11->data = (uint64_t *)0x0;
  pcVar11->data_size = 0;
  pqVar3 = createQueue(5);
  enque(pcVar4,pqVar3);
  enque(pcVar7,pqVar3);
  enque(pcVar8,pqVar3);
  enque(pcVar9,pqVar3);
  enque(pcVar10,pqVar3);
  _Var1 = enque(pcVar11,pqVar3);
  if (_Var1) {
    __assert_fail("enque(one_too_many, q) == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/chunkTests.c"
                  ,0x7b,"void testChunkLimit()");
  }
  puts(" passed");
  destroyQueue(pqVar3);
  destroyChunk(pcVar11);
  printf("testChunkQueueBuffer()");
  pcVar4 = createChunk();
  pcVar4->action = '\a';
  puVar5 = (uint64_t *)malloc(7);
  pcVar4->data = puVar5;
  *(undefined4 *)puVar5 = 0x61746144;
  *(undefined4 *)((long)puVar5 + 3) = 0x312061;
  pcVar4->data_size = 6;
  pcVar7 = createChunk();
  pcVar7->action = '\a';
  puVar5 = (uint64_t *)malloc(7);
  pcVar7->data = puVar5;
  *(undefined4 *)puVar5 = 0x61746144;
  *(undefined4 *)((long)puVar5 + 3) = 0x322061;
  pcVar7->data_size = 6;
  pcVar8 = createChunk();
  pcVar8->action = '\a';
  puVar5 = (uint64_t *)malloc(7);
  pcVar8->data = puVar5;
  *(undefined4 *)puVar5 = 0x61746144;
  *(undefined4 *)((long)puVar5 + 3) = 0x332061;
  pcVar8->data_size = 6;
  pcVar9 = createChunk();
  pcVar9->action = '\a';
  puVar5 = (uint64_t *)malloc(7);
  pcVar9->data = puVar5;
  *(undefined4 *)puVar5 = 0x61746144;
  *(undefined4 *)((long)puVar5 + 3) = 0x342061;
  pcVar9->data_size = 6;
  pcVar10 = createChunk();
  pcVar10->action = '\a';
  puVar5 = (uint64_t *)malloc(7);
  pcVar10->data = puVar5;
  *(undefined4 *)puVar5 = 0x61746144;
  *(undefined4 *)((long)puVar5 + 3) = 0x352061;
  pcVar10->data_size = 6;
  pqVar3 = createQueue(5);
  enque(pcVar10,pqVar3);
  enque(pcVar9,pqVar3);
  enque(pcVar8,pqVar3);
  enque(pcVar7,pqVar3);
  enque(pcVar4,pqVar3);
  deque(pqVar3);
  enque(pcVar8,pqVar3);
  _Var1 = enque(pcVar8,pqVar3);
  if (_Var1) {
    __assert_fail("enque(chunk3, q) == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/chunkTests.c"
                  ,0xae,"void testChunkQueueBuffer()");
  }
  deque(pqVar3);
  deque(pqVar3);
  enque(pcVar4,pqVar3);
  enque(pcVar7,pqVar3);
  _Var1 = enque(pcVar4,pqVar3);
  if (_Var1) {
    __assert_fail("enque(chunk1, q) == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/chunkTests.c"
                  ,0xb5,"void testChunkQueueBuffer()");
  }
  deque(pqVar3);
  deque(pqVar3);
  deque(pqVar3);
  enque(pcVar8,pqVar3);
  enque(pcVar9,pqVar3);
  enque(pcVar10,pqVar3);
  pcVar11 = front(pqVar3);
  iVar2 = strcmp((char *)pcVar11->data,"Data 1");
  if (iVar2 == 0) {
    deque(pqVar3);
    destroyChunk(pcVar4);
    pcVar4 = front(pqVar3);
    iVar2 = strcmp((char *)pcVar4->data,"Data 2");
    if (iVar2 != 0) {
      __assert_fail("strcmp((const char*)front(q)->data, DATA2) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/chunkTests.c"
                    ,0xc2,"void testChunkQueueBuffer()");
    }
    deque(pqVar3);
    destroyChunk(pcVar7);
    pcVar4 = front(pqVar3);
    iVar2 = strcmp((char *)pcVar4->data,"Data 3");
    if (iVar2 != 0) {
      __assert_fail("strcmp((const char*)front(q)->data, DATA3) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/chunkTests.c"
                    ,0xc5,"void testChunkQueueBuffer()");
    }
    deque(pqVar3);
    destroyChunk(pcVar8);
    pcVar4 = front(pqVar3);
    iVar2 = strcmp((char *)pcVar4->data,"Data 4");
    if (iVar2 != 0) {
      __assert_fail("strcmp((const char*)front(q)->data, DATA4) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/chunkTests.c"
                    ,200,"void testChunkQueueBuffer()");
    }
    deque(pqVar3);
    destroyChunk(pcVar9);
    pcVar4 = front(pqVar3);
    iVar2 = strcmp((char *)pcVar4->data,"Data 5");
    if (iVar2 == 0) {
      deque(pqVar3);
      destroyChunk(pcVar10);
      puts(" passed");
      destroyQueue(pqVar3);
      return;
    }
    __assert_fail("strcmp((const char*)front(q)->data, DATA5) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/chunkTests.c"
                  ,0xcb,"void testChunkQueueBuffer()");
  }
  __assert_fail("strcmp((const char*)front(q)->data, DATA1) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/chunkTests.c"
                ,0xbf,"void testChunkQueueBuffer()");
}

Assistant:

static void testCreateChunkQueue()
{
    printf("testCreateChunkQueue()");
    queue* q = createQueue(TEST_QUE_SIZE);
    assert(q->capacity == TEST_QUE_SIZE);
    assert(q->size == 0);
    assert(q->head == 1);
    assert(q->tail == 0);
    printf(" passed\n");

    destroyQueue(q);
}